

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

bool Dominates(VmBlock *a,VmBlock *b)

{
  bool bVar1;
  VmBlock *a_00;
  long lVar2;
  bool bVar3;
  
  if (a == b) {
    bVar3 = true;
  }
  else {
    bVar3 = (a->dominanceChildren).count != 0;
    if ((bVar3) && (a_00 = *(a->dominanceChildren).data, a_00 != b)) {
      lVar2 = 1;
      do {
        bVar1 = Dominates(a_00,b);
        if (bVar1) {
          return bVar3;
        }
        bVar3 = (uint)lVar2 < (a->dominanceChildren).count;
        if (!bVar3) {
          return bVar3;
        }
        a_00 = (a->dominanceChildren).data[lVar2];
        lVar2 = lVar2 + 1;
      } while (a_00 != b);
    }
  }
  return bVar3;
}

Assistant:

bool Dominates(VmBlock *a, VmBlock *b)
{
	if(a == b)
		return true;

	for(unsigned i = 0; i < a->dominanceChildren.size(); i++)
	{
		VmBlock *child = a->dominanceChildren[i];

		if(child == b)
			return true;

		if(Dominates(child, b))
			return true;
	}

	return false;
}